

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O2

int lj_cf_package_loader_croot(lua_State *L)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  int iVar3;
  
  iVar1 = 1;
  __s = luaL_checklstring(L,1,(size_t *)0x0);
  pcVar2 = strchr(__s,0x2e);
  iVar3 = 0;
  if (pcVar2 != (char *)0x0) {
    lua_pushlstring(L,__s,(long)pcVar2 - (long)__s);
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar2 = findfile(L,pcVar2,"cpath");
    iVar3 = iVar1;
    if ((pcVar2 != (char *)0x0) && (iVar1 = ll_loadfunc(L,pcVar2,__s,0), iVar1 != 0)) {
      if (iVar1 != 2) {
        loaderror(L,pcVar2);
      }
      lua_pushfstring(L,"\n\tno module \'%s\' in file \'%s\'",__s,pcVar2);
    }
  }
  return iVar3;
}

Assistant:

static int lj_cf_package_loader_croot(lua_State *L)
{
  const char *filename;
  const char *name = luaL_checkstring(L, 1);
  const char *p = strchr(name, '.');
  int st;
  if (p == NULL) return 0;  /* is root */
  lua_pushlstring(L, name, (size_t)(p - name));
  filename = findfile(L, lua_tostring(L, -1), "cpath");
  if (filename == NULL) return 1;  /* root not found */
  if ((st = ll_loadfunc(L, filename, name, 0)) != 0) {
    if (st != PACKAGE_ERR_FUNC) loaderror(L, filename);  /* real error */
    lua_pushfstring(L, "\n\tno module " LUA_QS " in file " LUA_QS,
		    name, filename);
    return 1;  /* function not found */
  }
  return 1;
}